

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.h
# Opt level: O3

FString __thiscall ExpVal::GetString(ExpVal *this)

{
  long *in_RSI;
  BYTE *copyStr;
  
  if ((PString *)*in_RSI == TypeString) {
    FString::AttachToOther((FString *)this,(FString *)(in_RSI + 1));
  }
  else {
    if ((PString *)*in_RSI == (PString *)TypeName) {
      copyStr = (BYTE *)FName::NameData.NameArray[(int)in_RSI[1]].Text;
    }
    else {
      copyStr = "";
    }
    FString::FString((FString *)this,(char *)copyStr);
  }
  return (FString)(char *)this;
}

Assistant:

const FString GetString() const
	{
		return Type == TypeString ? *(FString *)&pointer : Type == TypeName ? FString(FName(ENamedName(Int)).GetChars()) : "";
	}